

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ValueDriver * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueDriver,slang::ast::DriverKind&,slang::ast::Expression_const&,slang::ast::Symbol_const&,slang::bitmask<slang::ast::AssignFlags>&>
          (BumpAllocator *this,DriverKind *args,Expression *args_1,Symbol *args_2,
          bitmask<slang::ast::AssignFlags> *args_3)

{
  DriverKind DVar1;
  underlying_type uVar2;
  ValueDriver *pVVar3;
  DriverSource DVar4;
  
  pVVar3 = (ValueDriver *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ValueDriver *)this->endPtr < pVVar3 + 1) {
    pVVar3 = (ValueDriver *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pVVar3 + 1);
  }
  DVar1 = *args;
  uVar2 = args_3->m_bits;
  (pVVar3->prefixExpression).ptr = args_1;
  (pVVar3->containingSymbol).ptr = args_2;
  pVVar3->procCallExpression = (Expression *)0x0;
  (pVVar3->flags).m_bits = uVar2;
  pVVar3->kind = DVar1;
  pVVar3->isFromSideEffect = false;
  if (args_2->kind == Subroutine) {
    DVar4 = Subroutine;
  }
  else if (args_2->kind == ProceduralBlock) {
    DVar4 = (DriverSource)args_2[1].kind;
  }
  else {
    DVar4 = Other;
  }
  pVVar3->source = DVar4;
  return pVVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }